

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O0

void test_checksum(fitsfile *infits,FILE *out)

{
  int iVar1;
  int local_24;
  int local_20;
  int hduok;
  int dataok;
  int status;
  FILE *out_local;
  fitsfile *infits_local;
  
  hduok = 0;
  _dataok = out;
  out_local = (FILE *)infits;
  iVar1 = ffvcks(infits,&local_20,&local_24,&hduok);
  if (iVar1 == 0) {
    if (local_20 == -1) {
      wrtwrn(_dataok,"Data checksum is not consistent with  the DATASUM keyword",0);
    }
    if (local_24 == -1) {
      if (local_20 == 1) {
        wrtwrn(_dataok,"Invalid CHECKSUM means header has been modified. (DATASUM is OK) ",0);
      }
      else {
        wrtwrn(_dataok,"HDU checksum is not in agreement with CHECKSUM.",0);
      }
    }
  }
  else {
    wrtferr(_dataok,"verifying checksums: ",&hduok,2);
  }
  return;
}

Assistant:

void test_checksum(fitsfile *infits, 	/* input fits file   */ 
	      FILE	*out		/* output ascii file */
            )
{ 
    int status = 0; 
    int dataok, hduok;

    if (fits_verify_chksum(infits, &dataok, &hduok, &status))
    {
        wrtferr(out,"verifying checksums: ",&status,2);
        return;
    }

    if(dataok == -1)  
	wrtwrn(out,
        "Data checksum is not consistent with  the DATASUM keyword",0);

    if(hduok == -1 )  { 
	if(dataok == 1) { 
	   wrtwrn(out,
  "Invalid CHECKSUM means header has been modified. (DATASUM is OK) ",0);
        } 
	else {
	   wrtwrn(out, "HDU checksum is not in agreement with CHECKSUM.",0);
        }
    }
    return;
}